

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestCoherency::checkProgramWriteCoherency
          (TextureViewTestCoherency *this,_texture_type texture_type,bool should_use_images,
          _barrier_type barrier_type,_verification_mean verification_mean)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  char *pcVar7;
  void *pvVar8;
  byte *pbVar9;
  uint uVar10;
  float fVar11;
  uchar expected_data_ubyte [4];
  float expected_data_float [4];
  float start_rgba [4];
  float lerp_factor;
  float end_rgba [4];
  uchar *texel_ptr;
  uint x;
  uchar *row_ptr;
  uint y;
  bool is_data_correct;
  int epsilon;
  uchar *data_ptr;
  MessageBuilder local_1e8;
  uint local_64;
  uint local_60;
  uint invocation_y;
  uint invocation_x;
  uint n_invocation;
  int *result_data_ptr;
  uint n_invocations;
  GLuint read_to_id;
  uint read_lod;
  uint local_34;
  uint local_30;
  uint write_to_height;
  uint write_to_width;
  GLuint write_to_id;
  Functions *gl;
  _verification_mean verification_mean_local;
  _barrier_type barrier_type_local;
  bool should_use_images_local;
  TextureViewTestCoherency *pTStack_10;
  _texture_type texture_type_local;
  TextureViewTestCoherency *this_local;
  
  gl._0_4_ = verification_mean;
  gl._4_4_ = barrier_type;
  verification_mean_local._3_1_ = should_use_images;
  barrier_type_local = texture_type;
  pTStack_10 = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _write_to_width = CONCAT44(extraout_var,iVar2);
  write_to_height = 0;
  local_30 = 0;
  local_34 = 0;
  getWritePropertiesForTextureType(this,barrier_type_local,&write_to_height,&local_30,&local_34);
  if ((verification_mean_local._3_1_ & 1) == VERIFICATION_MEAN_PROGRAM >> 0x18) {
    (**(code **)(_write_to_width + 0x78))(0x8d40,this->m_draw_fbo_id);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glBindFramebuffer() call failed for GL_FRAMEBUFFER target",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x203d);
    (**(code **)(_write_to_width + 0x6a0))(0x8ca9,0x8ce0,0xde1,write_to_height,1);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glFramebufferTexture2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2040);
    (**(code **)(_write_to_width + 0x1a00))(0,0,local_30,local_34);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glViewport() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2046);
  }
  else {
    (**(code **)(_write_to_width + 0x80))(0,write_to_height,1,0,0,0x88b9,0x8058);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glBindImageTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2036);
  }
  if ((verification_mean_local._3_1_ & 1) == VERIFICATION_MEAN_PROGRAM >> 0x18) {
    (**(code **)(_write_to_width + 0x1680))(this->m_gradient_write_po_id);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"gluseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x207d);
    (**(code **)(_write_to_width + 0x538))(5,0,4);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2080);
  }
  else {
    (**(code **)(_write_to_width + 0x1680))(this->m_gradient_image_write_po_id);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x204e);
    (**(code **)(_write_to_width + 0x1530))
              (this->m_gradient_image_write_image_size_location,local_30,local_34);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glUniform2i() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2051);
    (**(code **)(_write_to_width + 0x5e0))();
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2054);
    (**(code **)(_write_to_width + 0x538))(0,0,local_30 * local_34);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2057);
    (**(code **)(_write_to_width + 0x4e8))(0x8c89);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glDisable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x205a);
    if (gl._4_4_ == BARRIER_TYPE_TEXTURE_FETCH_BARRIER_BIT) {
      (**(code **)(_write_to_width + 0xdb8))(8);
      dVar3 = (**(code **)(_write_to_width + 0x800))();
      glu::checkError(dVar3,"glMemoryBarrier() call failed for GL_TEXTURE_FETCH_BARRIER_BIT barrier"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x2064);
    }
    else {
      if (gl._4_4_ != BARRIER_TYPE_TEXTURE_UPDATE_BUFFER_BIT) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Unrecognized barrier type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x2075);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(_write_to_width + 0xdb8))(0x100);
      dVar3 = (**(code **)(_write_to_width + 0x800))();
      glu::checkError(dVar3,
                      "glMemoryBarrier() call failed for GL_TEXTURE_UPDATE_BARRIER_BIT barrier",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x206e);
    }
  }
  n_invocations = 0;
  result_data_ptr._4_4_ = 0;
  getReadPropertiesForTextureType
            (this,barrier_type_local,(GLuint *)((long)&result_data_ptr + 4),&n_invocations);
  (**(code **)(_write_to_width + 8))(0x84c0);
  dVar3 = (**(code **)(_write_to_width + 0x800))();
  glu::checkError(dVar3,"glActiveTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x208f);
  (**(code **)(_write_to_width + 0xb8))(0xde1,result_data_ptr._4_4_);
  dVar3 = (**(code **)(_write_to_width + 0x800))();
  glu::checkError(dVar3,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2092);
  if ((_verification_mean)gl == VERIFICATION_MEAN_PROGRAM) {
    result_data_ptr._0_4_ = local_30 * local_34;
    (**(code **)(_write_to_width + 0x1680))(this->m_gradient_verification_po_id);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x209b);
    (**(code **)(_write_to_width + 0x14f0))(this->m_gradient_verification_po_texture_location,0);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glUniform1i() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x209e);
    (**(code **)(_write_to_width + 0x14f0))
              (this->m_gradient_verification_po_sample_exact_uv_location,
               verification_mean_local._3_1_ & 1);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glUniform1i() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20a1);
    (**(code **)(_write_to_width + 0x14e0))
              ((float)n_invocations,this->m_gradient_verification_po_lod_location);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glUniform1f() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20a4);
    (**(code **)(_write_to_width + 0x5e0))(0x8c89);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20a7);
    (**(code **)(_write_to_width + 0x30))(0);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20aa);
    (**(code **)(_write_to_width + 0x538))(0,0,(uint)result_data_ptr);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20ad);
    (**(code **)(_write_to_width + 0x638))();
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20b0);
    (**(code **)(_write_to_width + 0x4e8))(0x8c89);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glDisable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20b3);
    _invocation_x = (**(code **)(_write_to_width + 0xcf8))(0x8c8e,35000);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glMapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20b8);
    if (_invocation_x == 0) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"glMapBuffer() did not generate an error but returned a NULL pointer",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x20bc);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    for (invocation_y = 0; invocation_y < (uint)result_data_ptr; invocation_y = invocation_y + 1) {
      if (*(int *)(_invocation_x + (ulong)invocation_y * 4) != 1) {
        local_60 = invocation_y % local_30;
        local_64 = invocation_y / local_30;
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_1e8,(char (*) [29])"Invalid data was sampled at ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2afcbef);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_60);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_64);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [22])") when sampling from ");
        pcVar7 = "a view";
        if (barrier_type_local == BARRIER_TYPE_NONE) {
          pcVar7 = "a texture";
        }
        data_ptr = (uchar *)pcVar7;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)&data_ptr);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1e8);
        (**(code **)(_write_to_width + 0x1670))(0x8c8e);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid data sampled",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x20cf);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    (**(code **)(_write_to_width + 0x1670))(0x8c8e);
    dVar3 = (**(code **)(_write_to_width + 0x800))();
    glu::checkError(dVar3,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20d5);
  }
  else {
    pvVar8 = operator_new__((ulong)(local_30 * local_34 * this->m_texture_n_components));
    (**(code **)(_write_to_width + 0xaa0))(0xde1,n_invocations,0x1908,0x1401,pvVar8);
    iVar2 = (**(code **)(_write_to_width + 0x800))();
    if (iVar2 != 0) {
      if (pvVar8 != (void *)0x0) {
        operator_delete__(pvVar8);
      }
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"glGetTexImage() call failed.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x20e6);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    bVar1 = true;
    for (row_ptr._4_4_ = 0; row_ptr._4_4_ < local_34; row_ptr._4_4_ = row_ptr._4_4_ + 1) {
      uVar10 = row_ptr._4_4_ * this->m_texture_n_components * local_30;
      for (texel_ptr._4_4_ = 0; texel_ptr._4_4_ < local_30; texel_ptr._4_4_ = texel_ptr._4_4_ + 1) {
        pbVar9 = (byte *)((long)pvVar8 +
                         (ulong)(texel_ptr._4_4_ * this->m_texture_n_components) + (ulong)uVar10);
        fVar11 = (float)texel_ptr._4_4_ / (float)local_30;
        iVar2 = de::abs<int>((uint)*pbVar9 -
                             ((int)(((1.0 - fVar11) * 1.0 + fVar11 * 0.0) * 255.0) & 0xffU));
        if ((((1 < iVar2) ||
             (iVar2 = de::abs<int>((uint)pbVar9[1] -
                                   ((int)(((1.0 - fVar11) * 0.9 + fVar11 * 0.1) * 255.0) & 0xffU)),
             1 < iVar2)) ||
            (iVar2 = de::abs<int>((uint)pbVar9[2] -
                                  ((int)(((1.0 - fVar11) * 0.0 + fVar11 * 1.0) * 255.0) & 0xffU)),
            1 < iVar2)) ||
           (iVar2 = de::abs<int>((uint)pbVar9[3] -
                                 ((int)(((1.0 - fVar11) * 0.0 + fVar11 * 1.0) * 255.0) & 0xffU)),
           1 < iVar2)) {
          bVar1 = false;
          break;
        }
      }
    }
    if (pvVar8 != (void *)0x0) {
      operator_delete__(pvVar8);
    }
    if (!bVar1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid data sampled",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x2115);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return;
}

Assistant:

void TextureViewTestCoherency::checkProgramWriteCoherency(_texture_type texture_type, bool should_use_images,
														  _barrier_type		 barrier_type,
														  _verification_mean verification_mean)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (!should_use_images)
	{
		/* Sanity check: no barrier should be requested if images are not used */
		DE_ASSERT(barrier_type == BARRIER_TYPE_NONE);

		/* Sanity check: glGetTexImage*() call should only be used for verification
		 *               when images are used */
		DE_ASSERT(verification_mean == VERIFICATION_MEAN_PROGRAM);
	}

	/* Determine GL id of an object we will be rendering the gradient to */
	glw::GLuint  write_to_id	 = 0;
	unsigned int write_to_width  = 0;
	unsigned int write_to_height = 0;

	getWritePropertiesForTextureType(texture_type, &write_to_id, &write_to_width, &write_to_height);

	/* Configure the render targets */
	if (should_use_images)
	{
		gl.bindImageTexture(0,				/* unit */
							write_to_id, 1, /* second level */
							GL_FALSE,		/* layered */
							0,				/* layer */
							GL_WRITE_ONLY, GL_RGBA8);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture() call failed.");
	}
	else
	{
		/* We first need to fill either the texture or its sibling view with
		 * gradient data. Set up draw framebuffer */
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_draw_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed for GL_FRAMEBUFFER target");

		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, write_to_id, 1); /* level */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

		/* Configure the viewport accordingly */
		gl.viewport(0, /* x */
					0, /* y */
					write_to_width, write_to_height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");
	}

	/* The gradient needs to be rendered differently, depending on whether
	 * we're asked to use images or not */
	if (should_use_images)
	{
		gl.useProgram(m_gradient_image_write_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		gl.uniform2i(m_gradient_image_write_image_size_location, write_to_width, write_to_height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform2i() call failed.");

		gl.enable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, write_to_width * write_to_height);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
		}
		gl.disable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) call failed.");

		/* If the caller requested any barriers, issue them at this point */
		switch (barrier_type)
		{
		case BARRIER_TYPE_TEXTURE_FETCH_BARRIER_BIT:
		{
			gl.memoryBarrier(GL_TEXTURE_FETCH_BARRIER_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glMemoryBarrier() call failed for GL_TEXTURE_FETCH_BARRIER_BIT barrier");

			break;
		}

		case BARRIER_TYPE_TEXTURE_UPDATE_BUFFER_BIT:
		{
			gl.memoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glMemoryBarrier() call failed for GL_TEXTURE_UPDATE_BARRIER_BIT barrier");

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized barrier type");
		}
		} /* switch (barrier_type) */
	}	 /* if (should_use_images) */
	else
	{
		/* Render the gradient on a full-screen quad */
		gl.useProgram(m_gradient_write_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gluseProgram() call failed.");

		gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
	}

	/* Determine which texture and which mip-map level we will need to sample
	 * in order to verify whether the former operations have been completed
	 * successfully.
	 **/
	unsigned int read_lod   = 0;
	glw::GLuint  read_to_id = 0;

	getReadPropertiesForTextureType(texture_type, &read_to_id, &read_lod);

	/* Before we proceed with verification, update the texture binding so that
	 * the verification program can sample from the right texture */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

	gl.bindTexture(GL_TEXTURE_2D, read_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	if (verification_mean == VERIFICATION_MEAN_PROGRAM)
	{
		/* Switch to a verification program. It uses a vertex shader to sample
		 * all texels of the texture so issue as many invocations as necessary. */
		unsigned int n_invocations = write_to_width * write_to_height;

		gl.useProgram(m_gradient_verification_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		gl.uniform1i(m_gradient_verification_po_texture_location, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

		gl.uniform1i(m_gradient_verification_po_sample_exact_uv_location, should_use_images);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

		gl.uniform1f(m_gradient_verification_po_lod_location, (float)read_lod);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f() call failed.");

		gl.enable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");

		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, n_invocations);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

		gl.disable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) call failed.");

		/* Map the result buffer object storage into process space */
		const int* result_data_ptr = (const int*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

		if (result_data_ptr == DE_NULL)
		{
			TCU_FAIL("glMapBuffer() did not generate an error but returned a NULL pointer");
		}

		/* Verify the XFBed data */
		for (unsigned int n_invocation = 0; n_invocation < n_invocations; ++n_invocation)
		{
			if (result_data_ptr[n_invocation] != 1)
			{
				unsigned int invocation_x = n_invocation % write_to_width;
				unsigned int invocation_y = n_invocation / write_to_width;

				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled at "
								   << "(" << invocation_x << ", " << invocation_y << ") when sampling from "
								   << ((texture_type == TEXTURE_TYPE_PARENT_TEXTURE) ? "a texture" : "a view")
								   << tcu::TestLog::EndMessage;

				/* Make sure the buffer is unmapped before throwing the exception */
				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

				TCU_FAIL("Invalid data sampled");
			}
		} /* for (all invocations) */

		/* Unmap the buffer storage */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
	} /* if (verification_mean == VERIFICATION_MEAN_PROGRAM) */
	else
	{
		DE_ASSERT(verification_mean == VERIFICATION_MEAN_GLGETTEXIMAGE);

		/* Allocate space for the data */
		unsigned char* data_ptr = new unsigned char[write_to_width * write_to_height * m_texture_n_components];

		/* Retrieve the rendered data */
		gl.getTexImage(GL_TEXTURE_2D, read_lod, GL_RGBA, GL_UNSIGNED_BYTE, data_ptr);

		if (gl.getError() != GL_NO_ERROR)
		{
			/* Release the buffer before we throw an exception */
			delete[] data_ptr;

			TCU_FAIL("glGetTexImage() call failed.");
		}

		/* Verify the data is correct */
		const int epsilon		  = 1;
		bool	  is_data_correct = true;

		for (unsigned int y = 0; y < write_to_height; ++y)
		{
			const unsigned char* row_ptr = data_ptr + y * m_texture_n_components * write_to_width;

			for (unsigned int x = 0; x < write_to_width; ++x)
			{
				const unsigned char* texel_ptr	= row_ptr + x * m_texture_n_components;
				const float			 end_rgba[]   = { 0.0f, 0.1f, 1.0f, 1.0f };
				const float			 lerp_factor  = float(x) / float(write_to_width);
				const float			 start_rgba[] = { 1.0f, 0.9f, 0.0f, 0.0f };
				const float expected_data_float[] = { start_rgba[0] * (1.0f - lerp_factor) + end_rgba[0] * lerp_factor,
													  start_rgba[1] * (1.0f - lerp_factor) + end_rgba[1] * lerp_factor,
													  start_rgba[2] * (1.0f - lerp_factor) + end_rgba[2] * lerp_factor,
													  start_rgba[3] * (1.0f - lerp_factor) +
														  end_rgba[3] * lerp_factor };
				const unsigned char expected_data_ubyte[] = { (unsigned char)(expected_data_float[0] * 255.0f),
															  (unsigned char)(expected_data_float[1] * 255.0f),
															  (unsigned char)(expected_data_float[2] * 255.0f),
															  (unsigned char)(expected_data_float[3] * 255.0f) };

				if (de::abs((int)texel_ptr[0] - (int)expected_data_ubyte[0]) > epsilon ||
					de::abs((int)texel_ptr[1] - (int)expected_data_ubyte[1]) > epsilon ||
					de::abs((int)texel_ptr[2] - (int)expected_data_ubyte[2]) > epsilon ||
					de::abs((int)texel_ptr[3] - (int)expected_data_ubyte[3]) > epsilon)
				{
					is_data_correct = false;

					break;
				}
			}
		} /* for (all rows) */

		/* Good to release the data buffer at this point */
		delete[] data_ptr;

		data_ptr = DE_NULL;

		/* Fail the test if any of the rendered texels were found invalid */
		if (!is_data_correct)
		{
			TCU_FAIL("Invalid data sampled");
		}
	}
}